

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_client.c
# Opt level: O1

int mbedtls_ssl_tls12_write_client_hello_exts
              (mbedtls_ssl_context *ssl,uchar *buf,uchar *end,int uses_ec,size_t *out_len)

{
  mbedtls_ssl_handshake_params *pmVar1;
  bool bVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  uchar *puVar5;
  int line;
  char *text;
  uchar *puVar6;
  size_t local_40;
  uchar *local_38;
  
  *out_len = 0;
  puVar6 = buf;
  local_38 = end;
  if (uses_ec != 0) {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x6a,"client hello, adding supported_point_formats extension");
    if ((ulong)((long)local_38 - (long)buf) < 6 || local_38 < buf) {
      iVar3 = -0x6a00;
      text = "ssl_write_supported_point_formats_ext";
      line = 0x222;
      goto LAB_001aa2f7;
    }
    buf[0] = '\0';
    buf[1] = '\v';
    buf[2] = '\0';
    buf[3] = '\x02';
    buf[4] = '\x01';
    buf[5] = '\0';
    puVar6 = buf + 6;
  }
  local_40 = 0;
  iVar3 = mbedtls_ecjpake_check(&ssl->handshake->ecjpake_ctx);
  if (iVar3 == 0) {
    lVar4 = 0;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
               ,0x97,"client hello, adding ecjpake_kkpp extension");
    iVar3 = -0x6a00;
    if (3 < (ulong)((long)local_38 - (long)puVar6) && puVar6 <= local_38) {
      puVar6[0] = '\x01';
      puVar6[1] = '\0';
      if ((ssl->handshake->ecjpake_cache == (uchar *)0x0) ||
         (ssl->handshake->ecjpake_cache_len == 0)) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0xa5,"generating new ecjpake parameters");
        iVar3 = mbedtls_ecjpake_write_round_one
                          (&ssl->handshake->ecjpake_ctx,puVar6 + 4,
                           (size_t)(local_38 + (-2 - (long)(puVar6 + 2))),&local_40,
                           (_func_int_void_ptr_uchar_ptr_size_t *)ssl->conf->f_rng,ssl->conf->p_rng)
        ;
        __n = local_40;
        if (iVar3 == 0) {
          puVar5 = (uchar *)calloc(1,local_40);
          pmVar1 = ssl->handshake;
          pmVar1->ecjpake_cache = puVar5;
          if (puVar5 != (uchar *)0x0) {
            memcpy(puVar5,puVar6 + 4,__n);
            pmVar1->ecjpake_cache_len = __n;
            goto LAB_001aa34e;
          }
          lVar4 = 0;
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0xbe,"allocation failed");
          iVar3 = -0x7f00;
        }
        else {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                     ,0xb7,"mbedtls_ecjpake_write_round_one",iVar3);
          lVar4 = 0;
        }
      }
      else {
        lVar4 = 0;
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                   ,0xc5,"re-using cached ecjpake parameters");
        local_40 = ssl->handshake->ecjpake_cache_len;
        puVar5 = puVar6 + 4;
        if (local_40 <= (ulong)((long)local_38 - (long)puVar5) && puVar5 <= local_38) {
          memcpy(puVar5,ssl->handshake->ecjpake_cache,local_40);
LAB_001aa34e:
          *(ushort *)(puVar6 + 2) = (ushort)local_40 << 8 | (ushort)local_40 >> 8;
          lVar4 = local_40 + 4;
          goto LAB_001aa0b3;
        }
      }
    }
  }
  else {
    lVar4 = 0;
LAB_001aa0b3:
    iVar3 = 0;
  }
  if (iVar3 == 0) {
    puVar6 = puVar6 + lVar4;
    bVar2 = true;
    if (ssl->conf->mfl_code == '\0') {
      lVar4 = 0;
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
                 ,0x111,"client hello, adding max_fragment_length extension");
      if ((ulong)((long)local_38 - (long)puVar6) < 5 || local_38 < puVar6) {
        iVar3 = -0x6a00;
        lVar4 = 0;
        bVar2 = false;
      }
      else {
        puVar6[0] = '\0';
        puVar6[1] = '\x01';
        puVar6[2] = '\0';
        puVar6[3] = '\x01';
        puVar6[4] = ssl->conf->mfl_code;
        lVar4 = 5;
      }
    }
    if (bVar2) {
      *out_len = (size_t)(puVar6 + (lVar4 - (long)buf));
      return 0;
    }
    text = "ssl_write_max_fragment_length_ext";
    line = 0x23c;
  }
  else {
    text = "ssl_write_ecjpake_kkpp_ext";
    line = 0x22b;
  }
LAB_001aa2f7:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_client.c"
             ,line,text,iVar3);
  return iVar3;
}

Assistant:

int mbedtls_ssl_tls12_write_client_hello_exts(mbedtls_ssl_context *ssl,
                                              unsigned char *buf,
                                              const unsigned char *end,
                                              int uses_ec,
                                              size_t *out_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p = buf;
    size_t ext_len = 0;

    (void) ssl;
    (void) end;
    (void) uses_ec;
    (void) ret;
    (void) ext_len;

    *out_len = 0;

    /* Note that TLS_EMPTY_RENEGOTIATION_INFO_SCSV is always added
     * even if MBEDTLS_SSL_RENEGOTIATION is not defined. */
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if ((ret = ssl_write_renegotiation_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_renegotiation_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_SOME_ECDH_OR_ECDHE_1_2_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDSA_CERT_REQ_ALLOWED_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if (uses_ec) {
        if ((ret = ssl_write_supported_point_formats_ext(ssl, p, end,
                                                         &ext_len)) != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_supported_point_formats_ext", ret);
            return ret;
        }
        p += ext_len;
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if ((ret = ssl_write_ecjpake_kkpp_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_ecjpake_kkpp_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_DTLS_CONNECTION_ID)
    if ((ret = ssl_write_cid_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_cid_ext", ret);
        return ret;
    }
    p += ext_len;
#endif /* MBEDTLS_SSL_DTLS_CONNECTION_ID */

#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    if ((ret = ssl_write_max_fragment_length_ext(ssl, p, end,
                                                 &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_max_fragment_length_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
    if ((ret = ssl_write_encrypt_then_mac_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_encrypt_then_mac_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
    if ((ret = ssl_write_extended_ms_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_extended_ms_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_DTLS_SRTP)
    if ((ret = ssl_write_use_srtp_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_use_srtp_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

#if defined(MBEDTLS_SSL_SESSION_TICKETS)
    if ((ret = ssl_write_session_ticket_ext(ssl, p, end, &ext_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_write_session_ticket_ext", ret);
        return ret;
    }
    p += ext_len;
#endif

    *out_len = p - buf;

    return 0;
}